

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O3

int __thiscall FTextureManager::CountBuildTiles(FTextureManager *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *copyStr;
  long lVar5;
  FILE *__stream;
  int *piVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  ulong __n;
  uint uVar10;
  FString rffpath;
  char artfile [13];
  FString artpath;
  int local_64;
  FString local_60;
  char local_58 [16];
  FTextureManager *local_48;
  TArray<unsigned_char_*,_unsigned_char_*> *local_40;
  FString local_38;
  
  builtin_strncpy(local_58,"tilesXXX.art",0xd);
  uVar10 = 0;
  local_48 = this;
  iVar2 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0);
  local_64 = 0;
  if (iVar2 < 0) {
LAB_004f7344:
    local_40 = &local_48->BuildTileFiles;
    iVar2 = 1000 - uVar10;
    uVar8 = uVar10 + 0x30;
    do {
      uVar9 = (uVar10 & 0xffff) / 10;
      cVar1 = (char)uVar9;
      local_58[7] = (char)uVar8 + cVar1 * -10;
      local_58[5] = (byte)((uVar10 & 0xffff) / 100) | 0x30;
      local_58[6] = cVar1 + ((byte)((uVar9 & 0xff) / 5) & 0xfe) * -5 | 0x30;
      iVar3 = FWadCollection::CheckNumForFullName(&Wads,local_58,false,0);
      if (iVar3 < 0) {
        return local_64;
      }
      iVar4 = FWadCollection::LumpLength(&Wads,iVar3);
      piVar6 = (int *)operator_new__((long)iVar4);
      FWadCollection::ReadLump(&Wads,iVar3,piVar6);
      if ((*piVar6 == 1) &&
         (iVar3 = (piVar6[3] - piVar6[2]) + 1, piVar6[2] <= piVar6[3] && iVar3 != 0)) {
        TArray<unsigned_char_*,_unsigned_char_*>::Grow(local_40,1);
        uVar9 = (local_48->BuildTileFiles).Count;
        (local_48->BuildTileFiles).Array[uVar9] = (uchar *)piVar6;
        (local_48->BuildTileFiles).Count = uVar9 + 1;
        local_64 = local_64 + iVar3;
      }
      else {
        operator_delete__(piVar6);
      }
      uVar8 = (uint)(byte)((char)uVar8 + 1);
      uVar10 = uVar10 + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  else {
    iVar2 = FWadCollection::GetLumpFile(&Wads,iVar2);
    copyStr = FWadCollection::GetWadFullName(&Wads,iVar2);
    FString::FString(&local_60,copyStr);
    lVar5 = FString::LastIndexOf(&local_60,'/');
    if ((int)lVar5 < 0) {
      FString::operator+=(&local_60,'/');
    }
    else {
      FString::Truncate(&local_60,(ulong)((int)lVar5 + 1));
    }
    local_40 = &local_48->BuildTileFiles;
    uVar10 = 0;
    local_64 = 0;
    do {
      uVar8 = (uVar10 & 0xffff) / 10;
      cVar1 = (char)uVar8;
      local_58[5] = (byte)((uVar10 & 0xffff) / 100) | 0x30;
      local_58[6] = cVar1 + ((byte)((uVar8 & 0xff) / 5) & 0xfe) * -5 | 0x30;
      local_58[7] = cVar1 * -10 + '0' + (char)uVar10;
      FString::AttachToOther(&local_38,&local_60);
      FString::operator+=(&local_38,local_58);
      __stream = fopen(local_38.Chars,"rb");
      if (__stream == (FILE *)0x0) {
        FString::~FString(&local_38);
        FString::~FString(&local_60);
        if (999 < uVar10) {
          return local_64;
        }
        goto LAB_004f7344;
      }
      iVar2 = Q_filelength((FILE *)__stream);
      __n = (ulong)iVar2;
      piVar6 = (int *)operator_new__(__n);
      sVar7 = fread(piVar6,1,__n,__stream);
      if (((sVar7 == __n) && (*piVar6 == 1)) &&
         (iVar2 = (piVar6[3] - piVar6[2]) + 1, piVar6[2] <= piVar6[3] && iVar2 != 0)) {
        TArray<unsigned_char_*,_unsigned_char_*>::Grow(local_40,1);
        uVar8 = (local_48->BuildTileFiles).Count;
        (local_48->BuildTileFiles).Array[uVar8] = (uchar *)piVar6;
        (local_48->BuildTileFiles).Count = uVar8 + 1;
        local_64 = local_64 + iVar2;
      }
      else {
        operator_delete__(piVar6);
      }
      fclose(__stream);
      FString::~FString(&local_38);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 1000);
    FString::~FString(&local_60);
  }
  return local_64;
}

Assistant:

int FTextureManager::CountBuildTiles ()
{
	int numartfiles = 0;
	char artfile[] = "tilesXXX.art";
	int lumpnum;
	int numtiles;
	int totaltiles = 0;

	lumpnum = Wads.CheckNumForFullName ("blood.pal");
	if (lumpnum >= 0)
	{
		// Blood's tiles are external resources. (Why did they do it like that?)
		FString rffpath = Wads.GetWadFullName (Wads.GetLumpFile (lumpnum));
		int slashat = rffpath.LastIndexOf ('/');
		if (slashat >= 0)
		{
			rffpath.Truncate (slashat + 1);
		}
		else
		{
			rffpath += '/';
		}

		for (; numartfiles < 1000; numartfiles++)
		{
			artfile[5] = numartfiles / 100 + '0';
			artfile[6] = numartfiles / 10 % 10 + '0';
			artfile[7] = numartfiles % 10 + '0';

			FString artpath = rffpath;
			artpath += artfile;

			FILE *f = fopen (artpath, "rb");
			if (f == NULL)
			{
				break;
			}

			size_t len = Q_filelength (f);
			BYTE *art = new BYTE[len];
			if (fread (art, 1, len, f) != len || (numtiles = CountTiles(art)) == 0)
			{
				delete[] art;
			}
			else
			{
				BuildTileFiles.Push (art);
				totaltiles += numtiles;
			}
			fclose (f);
		}
	}

	for (; numartfiles < 1000; numartfiles++)
	{
		artfile[5] = numartfiles / 100 + '0';
		artfile[6] = numartfiles / 10 % 10 + '0';
		artfile[7] = numartfiles % 10 + '0';
		lumpnum = Wads.CheckNumForFullName (artfile);
		if (lumpnum < 0)
		{
			break;
		}

		BYTE *art = new BYTE[Wads.LumpLength (lumpnum)];
		Wads.ReadLump (lumpnum, art);

		if ((numtiles = CountTiles(art)) == 0)
		{
			delete[] art;
		}
		else
		{
			BuildTileFiles.Push (art);
			totaltiles += numtiles;
		}
	}
	return totaltiles;
}